

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

QSize __thiscall
QDockWidgetLayout::sizeFromContent(QDockWidgetLayout *this,QSize *content,bool floating)

{
  QMargins m;
  QMargins m_00;
  byte bVar1;
  bool bVar2;
  ushort uVar3;
  undefined4 uVar4;
  int iVar5;
  QDockWidgetLayout *this_00;
  QStyle *pQVar6;
  pointer pQVar7;
  QSize QVar8;
  byte in_DL;
  undefined8 *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  uint explicitMax;
  uint explicitMin;
  int th;
  int fw;
  bool nativeDeco;
  QDockWidget *w;
  QSize max;
  QSize min;
  QMargins margins;
  QSize result;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  QDockWidgetLayout *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  uint uVar9;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff38;
  int local_50;
  int local_4c [7];
  int local_30;
  int local_2c [3];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  local_10 = *in_RSI;
  if ((in_RDI->field_0x1c & 1) == 0) {
    local_2c[2] = QSize::height((QSize *)0x58aaec);
    local_2c[1] = 0;
    qMax<int>(local_2c + 2,local_2c + 1);
    QSize::setHeight((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    local_2c[0] = QSize::width((QSize *)0x58ab2c);
    local_30 = minimumTitleWidth((QDockWidgetLayout *)CONCAT17(bVar1,in_stack_ffffffffffffff38));
    qMax<int>(local_2c,&local_30);
    QSize::setWidth((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  }
  else {
    local_14 = QSize::height((QSize *)0x58aa5e);
    local_18 = minimumTitleWidth((QDockWidgetLayout *)CONCAT17(bVar1,in_stack_ffffffffffffff38));
    qMax<int>(&local_14,&local_18);
    QSize::setHeight((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    local_1c = QSize::width((QSize *)0x58aaa4);
    local_20 = 0;
    qMax<int>(&local_1c,&local_20);
    QSize::setWidth((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  }
  QLayout::parentWidget((QLayout *)in_RDI);
  this_00 = (QDockWidgetLayout *)qobject_cast<QDockWidget*>((QObject *)0x58ab7a);
  bVar2 = nativeWindowDeco(in_stack_ffffffffffffff00,
                           SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
  uVar9 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff2c);
  if (((bVar1 & 1) == 0) || (bVar2)) {
    uVar4 = 0;
  }
  else {
    pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                           );
    uVar4 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x12,0,this_00);
  }
  uVar10 = uVar4;
  titleHeight(this_00);
  if ((uVar9 & 0x1000000) == 0) {
    if ((in_RDI->field_0x1c & 1) == 0) {
      QSize::QSize((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                   in_stack_fffffffffffffef8);
      QSize::operator+=((QSize *)in_stack_ffffffffffffff00,
                        (QSize *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    }
    else {
      QSize::QSize((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                   in_stack_fffffffffffffef8);
      QSize::operator+=((QSize *)in_stack_ffffffffffffff00,
                        (QSize *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    }
  }
  local_4c[2] = QSize::height((QSize *)0x58ac77);
  local_4c[1] = 0xffffff;
  qMin<int>(local_4c + 2,local_4c + 1);
  QSize::setHeight((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  local_4c[0] = QSize::width((QSize *)0x58acba);
  local_50 = 0xffffff;
  qMin<int>(local_4c,&local_50);
  QSize::setWidth((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  iVar5 = QSize::width((QSize *)0x58acfa);
  if (iVar5 < 0) {
    QSize::setWidth((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  }
  iVar5 = QSize::height((QSize *)0x58ad1b);
  if (iVar5 < 0) {
    QSize::setHeight((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  }
  QWidget::contentsMargins((QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
  ;
  QWidget::minimumSize(in_RDI);
  m.m_top.m_i = uVar9;
  m.m_left.m_i = uVar10;
  m._8_8_ = this_00;
  QSize::shrunkBy((QSize *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),m);
  QWidget::maximumSize(in_RDI);
  m_00.m_top.m_i = uVar9;
  m_00.m_left.m_i = uVar10;
  m_00._8_8_ = this_00;
  QSize::shrunkBy((QSize *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),m_00);
  uVar3 = 0;
  uVar9 = 0;
  QDockWidget::d_func((QDockWidget *)0x58ae3e);
  bVar2 = std::operator!=((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)
                          in_stack_ffffffffffffff00,
                          (nullptr_t)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (bVar2) {
    QDockWidget::d_func((QDockWidget *)0x58ae5e);
    pQVar7 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x58ae6a);
    uVar3 = *(ushort *)&pQVar7->field_0x7c & 3;
    QDockWidget::d_func((QDockWidget *)0x58ae83);
    pQVar7 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x58ae8f);
    uVar9 = (uint)(*(ushort *)&pQVar7->field_0x7c >> 2 & 3);
  }
  if (((uVar3 & 1) == 0) || (iVar5 = QSize::width((QSize *)0x58aebb), iVar5 == 0)) {
    QSize::setWidth((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  }
  if (((uVar3 & 2) == 0) || (iVar5 = QSize::height((QSize *)0x58aeeb), iVar5 == 0)) {
    QSize::setHeight((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  }
  if ((uVar9 & 1) == 0) {
    QSize::setWidth((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  }
  if ((uVar9 & 2) == 0) {
    QSize::setHeight((QSize *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  }
  QSize::boundedTo((QSize *)CONCAT44(uVar4,in_stack_ffffffffffffff08),
                   (QSize *)in_stack_ffffffffffffff00);
  QVar8 = QSize::expandedTo((QSize *)CONCAT44(uVar4,in_stack_ffffffffffffff08),
                            (QSize *)in_stack_ffffffffffffff00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return QVar8;
}

Assistant:

QSize QDockWidgetLayout::sizeFromContent(const QSize &content, bool floating) const
{
    QSize result = content;

    if (verticalTitleBar) {
        result.setHeight(qMax(result.height(), minimumTitleWidth()));
        result.setWidth(qMax(content.width(), 0));
    } else {
        result.setHeight(qMax(result.height(), 0));
        result.setWidth(qMax(content.width(), minimumTitleWidth()));
    }

    QDockWidget *w = qobject_cast<QDockWidget*>(parentWidget());
    const bool nativeDeco = nativeWindowDeco(floating);

    int fw = floating && !nativeDeco
            ? w->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, w)
            : 0;

    const int th = titleHeight();
    if (!nativeDeco) {
        if (verticalTitleBar)
            result += QSize(th + 2*fw, 2*fw);
        else
            result += QSize(2*fw, th + 2*fw);
    }

    result.setHeight(qMin(result.height(), (int) QWIDGETSIZE_MAX));
    result.setWidth(qMin(result.width(), (int) QWIDGETSIZE_MAX));

    if (content.width() < 0)
        result.setWidth(-1);
    if (content.height() < 0)
        result.setHeight(-1);

    const QMargins margins = w->contentsMargins();
    //we need to subtract the contents margin (it will be added by the caller)
    QSize min = w->minimumSize().shrunkBy(margins);
    QSize max = w->maximumSize().shrunkBy(margins);

    /* A floating dockwidget will automatically get its minimumSize set to the layout's
       minimum size + deco. We're *not* interested in this, we only take minimumSize()
       into account if the user set it herself. Otherwise we end up expanding the result
       of a calculation for a non-floating dock widget to a floating dock widget's
       minimum size + window decorations. */

    uint explicitMin = 0;
    uint explicitMax = 0;
    if (w->d_func()->extra != nullptr) {
        explicitMin = w->d_func()->extra->explicitMinSize;
        explicitMax = w->d_func()->extra->explicitMaxSize;
    }

    if (!(explicitMin & Qt::Horizontal) || min.width() == 0)
        min.setWidth(-1);
    if (!(explicitMin & Qt::Vertical) || min.height() == 0)
        min.setHeight(-1);

    if (!(explicitMax & Qt::Horizontal))
        max.setWidth(QWIDGETSIZE_MAX);
    if (!(explicitMax & Qt::Vertical))
        max.setHeight(QWIDGETSIZE_MAX);

    return result.boundedTo(max).expandedTo(min);
}